

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Reader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::OneD::Code93Reader::decodePattern
          (Barcode *__return_storage_ptr__,Code93Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  ushort *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  Iterator puVar5;
  Iterator puVar6;
  ushort uVar7;
  long lVar8;
  uint local_164;
  string txt;
  Error error;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  string local_f0;
  Error local_d0;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 uStack_88;
  undefined4 uStack_87;
  undefined2 uStack_83;
  undefined1 uStack_81;
  undefined7 local_80;
  undefined1 uStack_79;
  short sStack_78;
  Type TStack_76;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined1 uStack_38;
  undefined4 local_37;
  undefined2 local_33;
  undefined1 local_31;
  
  FindLeftGuard<6,bool(*)(ZXing::PatternView_const&,int)>
            ((PatternView *)&error,(ZXing *)next,(PatternView *)0x1e,0x15d25b,
             (_func_bool_PatternView_ptr_int *)param_3);
  next->_base = (Iterator)
                CONCAT71(error._msg.field_2._M_allocated_capacity._1_7_,
                         error._msg.field_2._M_local_buf[0]);
  next->_end = (Iterator)error._msg.field_2._8_8_;
  next->_data = (Iterator)error._msg._M_dataplus._M_p;
  *(size_type *)&next->_size = error._msg._M_string_length;
  puVar5 = next->_data;
  puVar6 = next->_base;
  if ((puVar5 < puVar6 || puVar5 == (Iterator)0x0) || (next->_end < puVar5 + next->_size)) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (puVar6 == puVar5) {
    local_164 = 0;
  }
  else {
    uVar7 = 0;
    do {
      uVar7 = uVar7 + *puVar6;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar5);
    local_164 = (uint)uVar7;
  }
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  do {
    if ((next->_data == (Iterator)0x0) ||
       (puVar5 = next->_data + next->_size, next->_data = puVar5, next->_end < puVar5 + next->_size)
       ) goto LAB_0015ce02;
    iVar4 = RowReader::OneToFourBitPattern<6,9>(next);
    RowReader::LookupBitPattern<int[48],char[49]>
              (iVar4,(int (*) [48])CHARACTER_ENCODINGS,
               (char (*) [49])"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%abcd*");
    std::__cxx11::string::push_back((char)&txt);
    if (txt._M_dataplus._M_p[txt._M_string_length - 1] == '\0') goto LAB_0015ce02;
  } while (txt._M_dataplus._M_p[txt._M_string_length - 1] != '*');
  std::__cxx11::string::pop_back();
  if (2 < (int)txt._M_string_length) {
    puVar5 = next->_data;
    next->_size = 7;
    puVar1 = puVar5 + 7;
    if (puVar1 <= next->_end && (next->_base <= puVar5 && puVar5 != (Iterator)0x0)) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + *(short *)((long)puVar5 + lVar8);
        lVar8 = lVar8 + 2;
      } while (lVar8 != 0xc);
      if (puVar5[6] <= uVar7 >> 2) {
        if (puVar1 != next->_end + -1) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            uVar7 = uVar7 + *(short *)((long)puVar5 + lVar8);
            lVar8 = lVar8 + 2;
          } while (lVar8 != 0xe);
          if ((float)*puVar1 < (float)uVar7 * 0.5) goto LAB_0015ce02;
        }
        error._msg._M_dataplus._M_p = (pointer)&error._msg.field_2;
        error._msg._M_string_length = 0;
        error._msg.field_2._M_local_buf[0] = '\0';
        error._file._0_7_ = 0;
        error._file._7_1_ = 0;
        error._line = -1;
        error._type = None;
        bVar3 = CheckChecksums(&txt);
        if (!bVar3) {
          local_48 = 0;
          local_90 = 0;
          uStack_8f = uStack_3f;
          uStack_88 = uStack_38;
          uStack_87 = local_37;
          uStack_83 = local_33;
          uStack_81 = local_31;
          local_98 = 0;
          local_40 = 0;
          local_80 = 0x19889d;
          uStack_79 = 0;
          sStack_78 = 0x77;
          TStack_76 = Checksum;
          local_a0 = &local_90;
          local_50 = &local_40;
          std::__cxx11::string::operator=((string *)&error,(string *)&local_a0);
          error._line = sStack_78;
          error._type = TStack_76;
          error._file._0_7_ = local_80;
          error._file._7_1_ = uStack_79;
          if (local_a0 != &local_90) {
            operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
          }
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
          }
        }
        std::__cxx11::string::resize((ulong)&txt,(char)txt._M_string_length + -2);
        if (error._type == None) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,txt._M_dataplus._M_p,
                     txt._M_dataplus._M_p + txt._M_string_length);
          DecodeCode39AndCode93FullASCII(&local_70,&local_f0,"abcd");
          lVar8 = std::__cxx11::string::operator=((string *)&txt,(string *)&local_70);
          bVar3 = *(long *)(lVar8 + 8) == 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar3 = false;
        }
        if (bVar3) {
          local_110 = &local_100;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"ASCII decoding of Code93 failed","");
          if (local_110 == &local_100) {
            uStack_88 = (undefined1)uStack_f8;
            uStack_87 = (undefined4)((ulong)uStack_f8 >> 8);
            uStack_83 = (undefined2)((ulong)uStack_f8 >> 0x28);
            uStack_81 = (undefined1)((ulong)uStack_f8 >> 0x38);
            local_a0 = &local_90;
          }
          else {
            local_a0 = local_110;
          }
          uStack_8f = uStack_ff;
          local_90 = local_100;
          local_98 = local_108;
          local_108 = 0;
          local_100 = 0;
          local_80 = 0x19889d;
          uStack_79 = 0;
          sStack_78 = 0x7d;
          TStack_76 = Format;
          local_110 = &local_100;
          std::__cxx11::string::operator=((string *)&error,(string *)&local_a0);
          error._line = sStack_78;
          error._type = TStack_76;
          error._file._0_7_ = local_80;
          error._file._7_1_ = uStack_79;
          if (local_a0 != &local_90) {
            operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
          }
          if (local_110 != &local_100) {
            operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
          }
        }
        puVar5 = next->_base;
        if (puVar5 == next->_data + next->_size) {
          iVar4 = -1;
        }
        else {
          uVar7 = 0;
          do {
            uVar7 = uVar7 + *puVar5;
            puVar5 = puVar5 + 1;
          } while (puVar5 != next->_data + next->_size);
          iVar4 = uVar7 - 1;
        }
        paVar2 = &local_d0._msg.field_2;
        local_d0._msg._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,error._msg._M_dataplus._M_p,
                   error._msg._M_dataplus._M_p + error._msg._M_string_length);
        local_d0._file._0_7_ = error._file._0_7_;
        local_d0._40_3_ =
             SUB43(CONCAT13(error._type,CONCAT21(error._line,error._file._7_1_)) >> 8,0);
        local_d0._file._7_1_ = error._file._7_1_;
        Result::Result(__return_storage_ptr__,&txt,rowNumber,local_164,iVar4,Code93,
                       (SymbologyIdentifier)0x3047,&local_d0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._msg._M_dataplus._M_p != paVar2) {
          operator_delete(local_d0._msg._M_dataplus._M_p,
                          local_d0._msg.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)error._msg._M_dataplus._M_p != &error._msg.field_2) {
          operator_delete(error._msg._M_dataplus._M_p,
                          CONCAT71(error._msg.field_2._M_allocated_capacity._1_7_,
                                   error._msg.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0015ce19;
      }
    }
  }
LAB_0015ce02:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_0015ce19:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)txt._M_dataplus._M_p != &txt.field_2) {
    operator_delete(txt._M_dataplus._M_p,
                    CONCAT71(txt.field_2._M_allocated_capacity._1_7_,txt.field_2._M_local_buf[0]) +
                    1);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode Code93Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop, checksum and 1 payload characters)
	int minCharCount = 5;

	next = FindLeftGuard<CHAR_LEN>(next, minCharCount * CHAR_LEN, IsStartGuard);
	if (!next.isValid())
		return {};

	int xStart = next.pixelsInFront();

	std::string txt;
	txt.reserve(20);

	do {
		// check remaining input width
		if (!next.skipSymbol())
			return {};

		txt += LookupBitPattern(OneToFourBitPattern<CHAR_LEN, CHAR_SUM>(next), CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (txt.back() != '*');

	txt.pop_back(); // remove asterisk

	if (Size(txt) < minCharCount - 2)
		return {};

	// check termination bar (is present and not wider than about 2 modules) and quiet zone
	next = next.subView(0, CHAR_LEN + 1);
	if (!next.isValid() || next[CHAR_LEN] > next.sum(CHAR_LEN) / 4 || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	Error error;
	if (!CheckChecksums(txt))
		error = ChecksumError();

	// Remove checksum digits
	txt.resize(txt.size() - 2);

	if (!error && (txt = DecodeCode39AndCode93FullASCII(txt, "abcd")).empty())
		error = FormatError("ASCII decoding of Code93 failed");

	// Symbology identifier ISO/IEC 15424:2008 4.4.10 no modifiers
	SymbologyIdentifier symbologyIdentifier = {'G', '0'};

	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::Code93, symbologyIdentifier, error);
}